

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::LinearFunctionalConstraint>
::Container::Container(Container *this,int d,LinearFunctionalConstraint *c)

{
  undefined4 in_ESI;
  LinearFunctionalConstraint *in_RDI;
  LinearFunctionalConstraint *in_stack_ffffffffffffff28;
  
  LinearFunctionalConstraint::LinearFunctionalConstraint(in_RDI,in_stack_ffffffffffffff28);
  ExprWrapper<mp::LinearFunctionalConstraint>::ExprWrapper
            ((ExprWrapper<mp::LinearFunctionalConstraint> *)in_RDI,in_stack_ffffffffffffff28);
  LinearFunctionalConstraint::~LinearFunctionalConstraint(in_RDI);
  *(undefined4 *)&in_RDI[1].super_FunctionalConstraint.super_BasicConstraint.name_ = in_ESI;
  Context::Context((Context *)
                   &in_RDI[1].super_FunctionalConstraint.super_BasicConstraint.name_.field_0x4,
                   CTX_NONE);
  *(undefined1 *)&in_RDI[1].super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length
       = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length + 1) =
       0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length + 2) =
       0;
  return;
}

Assistant:

Container(int d, Constraint&& c) noexcept
      : con_(std::move(c)), depth_(d) { }